

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void QDirPrivate::sortFileList
               (SortFlags sort,QFileInfoList *l,QStringList *names,QFileInfoList *infos)

{
  QDirSortItemComparator __comp;
  QDirSortItemComparator __comp_00;
  bool bVar1;
  qsizetype qVar2;
  const_iterator o;
  QDirSortItem *pQVar3;
  QDirSortItem *pQVar4;
  reference this;
  long in_RCX;
  QVarLengthArray<QDirSortItem,_64LL> *in_RDX;
  QList<QFileInfo> *in_RSI;
  long in_FS_OFFSET;
  bool cached;
  QFileInfo *fileInfo;
  qsizetype i_1;
  qsizetype i;
  QFileInfo *fi;
  QFileInfoList *__range3;
  qsizetype n;
  QCollator coll;
  const_iterator __end3;
  const_iterator __begin3;
  QVarLengthArray<QDirSortItem,_64LL> si;
  undefined4 in_stack_fffffffffffff078;
  SortFlag in_stack_fffffffffffff07c;
  SortFlag in_stack_fffffffffffff080;
  undefined4 in_stack_fffffffffffff084;
  qsizetype in_stack_fffffffffffff088;
  QFlagsStorage<QDir::SortFlag> flags;
  QVarLengthArray<QDirSortItem,_64LL> *in_stack_fffffffffffff090;
  QDirSortItem *in_stack_fffffffffffff098;
  QCollator *in_stack_fffffffffffff0a8;
  QVarLengthArray<QDirSortItem,_64LL> *this_00;
  undefined8 in_stack_fffffffffffff0b0;
  QCollator *in_stack_fffffffffffff0b8;
  long local_f00;
  long local_ef8;
  const_iterator local_e30 [2];
  QVarLengthArray<QDirSortItem,_64LL> local_e20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QList<QFileInfo>::size(in_RSI);
  if (qVar2 != 0) {
    if (qVar2 != 1) {
      QFlags<QDir::SortFlag>::operator&
                ((QFlags<QDir::SortFlag> *)
                 CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                 in_stack_fffffffffffff07c);
      bVar1 = ::operator==((QFlagsStorageHelper<QDir::SortFlag,_4>)
                           SUB84((ulong)in_stack_fffffffffffff088 >> 0x20,0),
                           in_stack_fffffffffffff080);
      if (!bVar1) {
        memset(&local_e20,0xaa,0xe18);
        QVarLengthArray<QDirSortItem,_64LL>::QVarLengthArray(&local_e20);
        QVarLengthArray<QDirSortItem,_64LL>::reserve
                  (in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        for (local_ef8 = 0; flags.i = (Int)((ulong)in_stack_fffffffffffff088 >> 0x20),
            local_ef8 < qVar2; local_ef8 = local_ef8 + 1) {
          QList<QFileInfo>::at
                    ((QList<QFileInfo> *)
                     CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                     CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
          QVarLengthArray<QDirSortItem,64ll>::emplace_back<QFileInfo_const&,QFlags<QDir::SortFlag>&>
                    ((QVarLengthArray<QDirSortItem,_64LL> *)
                     CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                     (QFileInfo *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                     (QFlags<QDir::SortFlag> *)0x287ae9);
        }
        bVar1 = QFlags<QDir::SortFlag>::testAnyFlag
                          ((QFlags<QDir::SortFlag> *)
                           CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                           in_stack_fffffffffffff07c);
        if (bVar1) {
          QCollator::QCollator(in_stack_fffffffffffff0a8);
          QVLABase<QDirSortItem>::data(&local_e20.super_QVLABase<QDirSortItem>);
          QVLABase<QDirSortItem>::data(&local_e20.super_QVLABase<QDirSortItem>);
          QDirSortItemComparator::QDirSortItemComparator
                    ((QDirSortItemComparator *)
                     CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                     (SortFlags)flags.i,
                     (QCollator *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
          __comp.collator = in_stack_fffffffffffff0b8;
          __comp._0_8_ = in_stack_fffffffffffff0b0;
          std::sort<QDirSortItem*,QDirSortItemComparator>
                    (in_stack_fffffffffffff098,(QDirSortItem *)in_stack_fffffffffffff090,__comp);
          QCollator::~QCollator
                    ((QCollator *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
        }
        else {
          this_00 = &local_e20;
          pQVar3 = QVLABase<QDirSortItem>::data(&this_00->super_QVLABase<QDirSortItem>);
          pQVar4 = QVLABase<QDirSortItem>::data(&this_00->super_QVLABase<QDirSortItem>);
          pQVar4 = pQVar4 + qVar2;
          QDirSortItemComparator::QDirSortItemComparator
                    ((QDirSortItemComparator *)
                     CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                     (SortFlags)flags.i,
                     (QCollator *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
          __comp_00.collator = (QCollator *)pQVar4;
          __comp_00._0_8_ = pQVar3;
          std::sort<QDirSortItem*,QDirSortItemComparator>
                    (in_stack_fffffffffffff098,(QDirSortItem *)in_stack_fffffffffffff090,__comp_00);
        }
        for (local_f00 = 0; local_f00 < qVar2; local_f00 = local_f00 + 1) {
          QVLABase<QDirSortItem>::operator[]
                    ((QVLABase<QDirSortItem> *)
                     CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),0x287ce1);
          if (in_RCX != 0) {
            QList<QFileInfo>::append
                      ((QList<QFileInfo> *)
                       CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                       (parameter_type)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078)
                      );
          }
          if (in_RDX != (QVarLengthArray<QDirSortItem,_64LL> *)0x0) {
            this = QVLABase<QDirSortItem>::operator[]
                             ((QVLABase<QDirSortItem> *)
                              CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),0x287d41
                             );
            bVar1 = QString::isNull((QString *)0x287d52);
            in_stack_fffffffffffff090 = in_RDX;
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              QFileInfo::fileName((QFileInfo *)this);
            }
            else {
              QVLABase<QDirSortItem>::operator[]
                        ((QVLABase<QDirSortItem> *)
                         CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),0x287d83);
              QString::QString((QString *)
                               CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
            }
            QList<QString>::append
                      ((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                       (rvalue_ref)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
            QString::~QString((QString *)0x287dd8);
          }
        }
        QVarLengthArray<QDirSortItem,_64LL>::~QVarLengthArray(in_stack_fffffffffffff090);
        goto LAB_00287e3a;
      }
    }
    if (in_RCX != 0) {
      QList<QFileInfo>::operator=
                ((QList<QFileInfo> *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                 (QList<QFileInfo> *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
    }
    if (in_RDX != (QVarLengthArray<QDirSortItem,_64LL> *)0x0) {
      local_e30[0].i = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
      local_e30[0] = QList<QFileInfo>::begin
                               ((QList<QFileInfo> *)
                                CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
      o = QList<QFileInfo>::end
                    ((QList<QFileInfo> *)
                     CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
      while (bVar1 = QList<QFileInfo>::const_iterator::operator!=(local_e30,o), bVar1) {
        QList<QFileInfo>::const_iterator::operator*(local_e30);
        QFileInfo::fileName((QFileInfo *)in_stack_fffffffffffff098);
        QList<QString>::append
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
        QString::~QString((QString *)0x287a21);
        QList<QFileInfo>::const_iterator::operator++(local_e30);
      }
    }
  }
LAB_00287e3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QDirPrivate::sortFileList(QDir::SortFlags sort, const QFileInfoList &l,
                                      QStringList *names, QFileInfoList *infos)
{
    Q_ASSERT(names || infos);
    Q_ASSERT(!infos || infos->isEmpty());
    Q_ASSERT(!names || names->isEmpty());

    const qsizetype n = l.size();
    if (n == 0)
        return;

    if (n == 1 || (sort & QDir::SortByMask) == QDir::Unsorted) {
        if (infos)
            *infos = l;

        if (names) {
            for (const QFileInfo &fi : l)
                names->append(fi.fileName());
        }
    } else {
        QVarLengthArray<QDirSortItem, 64> si;
        si.reserve(n);
        for (qsizetype i = 0; i < n; ++i)
            si.emplace_back(l.at(i), sort);

#ifndef QT_BOOTSTRAPPED
    if (sort.testAnyFlag(QDir::LocaleAware)) {
            QCollator coll;
            std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort, &coll));
        } else {
            std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort));
        }
#else
        std::sort(si.data(), si.data() + n, QDirSortItemComparator(sort));
#endif // QT_BOOTSTRAPPED

        // put them back in the list(s)
        for (qsizetype i = 0; i < n; ++i) {
            auto &fileInfo = si[i].item;
            if (infos)
                infos->append(fileInfo);
            if (names) {
                const bool cached = !si[i].filename_cache.isNull();
                names->append(cached ? si[i].filename_cache : fileInfo.fileName());
            }
        }
    }
}